

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall Parser::error<char_const(&)[27]>(Parser *this,char (*args) [27])

{
  undefined8 uVar1;
  char local_1018 [8];
  char buf [4096];
  char (*args_local) [27];
  Parser *this_local;
  
  buf._4088_8_ = args;
  sprintf(local_1018,*args);
  if (this->tok == (Token *)0x0) {
    uVar1 = std::__cxx11::string::c_str();
    printf("%s: %s\n",uVar1,local_1018);
  }
  else {
    uVar1 = std::__cxx11::string::c_str();
    printf("%s:%d:%d: %s\n",uVar1,(ulong)(uint)(this->tok->pos).line,
           (ulong)(uint)(this->tok->pos).col,local_1018);
  }
  exit(1);
}

Assistant:

void error(Args&& ...args) {
    char buf[4096];
    std::sprintf(buf, std::forward<Args>(args)...);
    if (tok) {
      std::printf("%s:%d:%d: %s\n",
                  lex_data->fn.c_str(),
                  tok->pos.line,
                  tok->pos.col,
                  buf);
    }
    else {
      std::printf("%s: %s\n",
                  lex_data->fn.c_str(),
                  buf);
    }
    std::exit(1);
  }